

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
rebalance_or_split(btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                   *this,iterator *iter)

{
  field_type fVar1;
  field_type fVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  ushort uVar6;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  *pbVar7;
  template_ElementType<3UL> *ppbVar8;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  *pbVar9;
  node_type *dest;
  ushort uVar10;
  uint to_move;
  int iVar11;
  iterator parent_iter;
  
  fVar1 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
          ::count(iter->node);
  fVar2 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
          ::max_count(iter->node);
  if (fVar1 != fVar2) {
    __assert_fail("node->count() == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb53,
                  "void phmap::priv::btree<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                 );
  }
  fVar1 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
          ::max_count(iter->node);
  if (fVar1 != '=') {
    __assert_fail("kNodeValues == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb54,
                  "void phmap::priv::btree<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                 );
  }
  pbVar7 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
           ::parent(iter->node);
  if (iter->node ==
      (this->root_).
      super__Tuple_impl<0UL,_std::greater<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*>
      .
      super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*,_false>
      ._M_head_impl) {
    pbVar7 = new_internal_node(this,pbVar7);
    btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
    init_child(pbVar7,0,(this->root_).
                        super__Tuple_impl<0UL,_std::greater<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*>
                        .
                        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*,_false>
                        ._M_head_impl);
    (this->root_).
    super__Tuple_impl<0UL,_std::greater<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_*,_false>
    ._M_head_impl = pbVar7;
    ppbVar8 = btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
              ::GetField<3ul>((btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                               *)pbVar7);
    bVar5 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
            ::leaf(*ppbVar8);
    if ((bVar5) &&
       (ppbVar8 = btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                  ::GetField<3ul>((btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                                   *)pbVar7), *ppbVar8 != this->rightmost_)) {
      __assert_fail("!parent->child(0)->leaf() || parent->child(0) == rightmost_",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xba0,
                    "void phmap::priv::btree<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                   );
    }
  }
  else {
    fVar1 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
            ::position(iter->node);
    if (fVar1 != '\0') {
      bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              ::position(iter->node);
      ppbVar8 = btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                ::GetField<3ul>((btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                                 *)pbVar7);
      pbVar9 = ppbVar8[(ulong)bVar3 - 1];
      fVar1 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              ::max_count(pbVar9);
      if (fVar1 != '=') {
        __assert_fail("left->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb5c,
                      "void phmap::priv::btree<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                     );
      }
      bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              ::count(pbVar9);
      if (bVar3 < 0x3d) {
        bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                ::count(pbVar9);
        uVar6 = (short)(0x3d - (ushort)bVar3) / (short)((iter->position < 0x3d) + 1);
        uVar10 = 1;
        if (1 < (short)uVar6) {
          uVar10 = uVar6;
        }
        to_move = (uint)uVar10;
        if (((int)(uint)uVar10 <= iter->position) ||
           (bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                    ::count(pbVar9), bVar3 + to_move < 0x3d)) {
          btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
          ::rebalance_right_to_left(pbVar9,to_move,iter->node,(allocator_type *)this);
          bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                  ::max_count(iter->node);
          bVar4 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                  ::count(iter->node);
          if ((uint)bVar3 - (uint)bVar4 != to_move) {
            __assert_fail("node->max_count() - node->count() == to_move",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb69,
                          "void phmap::priv::btree<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                         );
          }
          iVar11 = iter->position - to_move;
          iter->position = iVar11;
          if (iVar11 < 0) {
            bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                    ::count(pbVar9);
            iter->position = (uint)bVar3 + iVar11 + 1;
            iter->node = pbVar9;
          }
          else {
            pbVar9 = iter->node;
          }
          bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                  ::count(pbVar9);
          bVar4 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                  ::max_count(iter->node);
          if (bVar3 < bVar4) {
            return;
          }
          __assert_fail("node->count() < node->max_count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xb70,
                        "void phmap::priv::btree<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                       );
        }
      }
    }
    bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
            ::position(iter->node);
    bVar4 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
            ::count(pbVar7);
    if (bVar3 < bVar4) {
      bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              ::position(iter->node);
      ppbVar8 = btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                ::GetField<3ul>((btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                                 *)pbVar7);
      pbVar9 = ppbVar8[(ulong)bVar3 + 1];
      fVar1 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              ::max_count(pbVar9);
      if (fVar1 != '=') {
        __assert_fail("right->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb79,
                      "void phmap::priv::btree<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                     );
      }
      bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              ::count(pbVar9);
      if (bVar3 < 0x3d) {
        bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                ::count(pbVar9);
        iVar11 = iter->position;
        uVar6 = (short)(0x3d - (ushort)bVar3) / (short)((0 < iVar11) + 1);
        uVar10 = 1;
        if (1 < (short)uVar6) {
          uVar10 = uVar6;
        }
        bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                ::count(iter->node);
        if ((iVar11 <= (int)((uint)bVar3 - (uint)uVar10)) ||
           (bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                    ::count(pbVar9), (uint)bVar3 + (uint)uVar10 < 0x3d)) {
          btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
          ::rebalance_left_to_right(iter->node,(uint)uVar10,pbVar9,(allocator_type *)this);
          iVar11 = iter->position;
          bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                  ::count(iter->node);
          pbVar7 = iter->node;
          if ((int)(uint)bVar3 < iVar11) {
            iVar11 = iter->position;
            bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                    ::count(pbVar7);
            iter->position = ~(uint)bVar3 + iVar11;
            iter->node = pbVar9;
            pbVar7 = pbVar9;
          }
          bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                  ::count(pbVar7);
          bVar4 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                  ::max_count(iter->node);
          if (bVar3 < bVar4) {
            return;
          }
          __assert_fail("node->count() < node->max_count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xb8b,
                        "void phmap::priv::btree<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                       );
        }
      }
    }
    fVar1 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
            ::max_count(pbVar7);
    if (fVar1 != '=') {
      __assert_fail("parent->max_count() == kNodeValues",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xb93,
                    "void phmap::priv::btree<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                   );
    }
    fVar1 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
            ::count(pbVar7);
    if (fVar1 == '=') {
      pbVar9 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
               ::parent(iter->node);
      bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              ::position(iter->node);
      parent_iter.position = (int)bVar3;
      parent_iter.node = pbVar9;
      rebalance_or_split(this,&parent_iter);
    }
  }
  bVar5 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
          ::leaf(iter->node);
  if (bVar5) {
    dest = new_leaf_node(this,pbVar7);
    btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
    split(iter->node,iter->position,dest,(allocator_type *)this);
    if (this->rightmost_ == iter->node) {
      this->rightmost_ = dest;
    }
  }
  else {
    dest = new_internal_node(this,pbVar7);
    btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
    split(iter->node,iter->position,dest,(allocator_type *)this);
  }
  iVar11 = iter->position;
  bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
          ::count(iter->node);
  if ((int)(uint)bVar3 < iVar11) {
    iVar11 = iter->position;
    bVar3 = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
            ::count(iter->node);
    iter->position = ~(uint)bVar3 + iVar11;
    iter->node = dest;
  }
  return;
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
        node_type *&node = iter->node;
        int &insert_position = iter->position;
        assert(node->count() == node->max_count());
        assert(kNodeValues == node->max_count());

        // First try to make room on the node by rebalancing.
        node_type *parent = node->parent();
        if (node != root()) {
            if (node->position() > 0) {
                // Try rebalancing with our left sibling.
                node_type *left = parent->child(node->position() - 1);
                assert(left->max_count() == kNodeValues);
                if (left->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the end of the right node then we bias rebalancing to
                    // fill up the left node.
                    int to_move = (kNodeValues - left->count()) /
                        (1 + (insert_position < kNodeValues));
                    to_move = (std::max)(1, to_move);

                    if (((insert_position - to_move) >= 0) ||
                        ((left->count() + to_move) < kNodeValues)) {
                        left->rebalance_right_to_left(to_move, node, mutable_allocator());

                        assert(node->max_count() - node->count() == to_move);
                        insert_position = insert_position - to_move;
                        if (insert_position < 0) {
                            insert_position = insert_position + left->count() + 1;
                            node = left;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            if (node->position() < parent->count()) {
                // Try rebalancing with our right sibling.
                node_type *right = parent->child(node->position() + 1);
                assert(right->max_count() == kNodeValues);
                if (right->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the _beginning of the left node then we bias rebalancing
                    // to fill up the right node.
                    int to_move =
                        (kNodeValues - right->count()) / (1 + (insert_position > 0));
                    to_move = (std::max)(1, to_move);

                    if ((insert_position <= (node->count() - to_move)) ||
                        ((right->count() + to_move) < kNodeValues)) {
                        node->rebalance_left_to_right(to_move, right, mutable_allocator());

                        if (insert_position > node->count()) {
                            insert_position = insert_position - node->count() - 1;
                            node = right;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            // Rebalancing failed, make sure there is room on the parent node for a new
            // value.
            assert(parent->max_count() == kNodeValues);
            if (parent->count() == kNodeValues) {
                iterator parent_iter(node->parent(), node->position());
                rebalance_or_split(&parent_iter);
            }
        } else {
            // Rebalancing not possible because this is the root node.
            // Create a new root node and set the current root node as the child of the
            // new root.
            parent = new_internal_node(parent);
            parent->init_child(0, root());
            mutable_root() = parent;
            // If the former root was a leaf node, then it's now the rightmost node.
            assert(!parent->child(0)->leaf() || parent->child(0) == rightmost_);
        }

        // Split the node.
        node_type *split_node;
        if (node->leaf()) {
            split_node = new_leaf_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
            if (rightmost_ == node) rightmost_ = split_node;
        } else {
            split_node = new_internal_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
        }

        if (insert_position > node->count()) {
            insert_position = insert_position - node->count() - 1;
            node = split_node;
        }
    }